

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3gau_full_io.c
# Opt level: O2

int s3gau_read_maybe_full
              (char *fn,vector_t *****out,uint32 *out_n_mgau,uint32 *out_n_feat,
              uint32 *out_n_density,uint32 **out_veclen,uint32 need_full)

{
  int iVar1;
  int32 iVar2;
  uint32 uVar3;
  FILE *fp;
  char *__s1;
  char *pcVar4;
  uint32 *buf;
  vector_t ****pppppfVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined4 uVar12;
  undefined7 uVar13;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar14;
  uint32 n_feat;
  uint32 swap;
  uint32 chksum;
  uint32 n_density;
  uint32 n_mgau;
  ulong local_78;
  undefined4 local_70;
  uint32 ignore;
  uint32 sv_chksum;
  uint32 n;
  uint32 *local_60;
  uint32 *local_58;
  uint32 **local_50;
  vector_t *****local_48;
  uint32 *local_40;
  float32 *raw;
  
  uVar14 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  chksum = 0;
  ignore = 0;
  local_48 = out;
  local_40 = out_n_mgau;
  fp = s3open(fn,"rb",&swap);
  if (fp == (FILE *)0x0) {
    return -1;
  }
  local_60 = out_n_feat;
  local_58 = out_n_density;
  local_50 = out_veclen;
  __s1 = s3get_gvn_fattr("version");
  if (__s1 == (char *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
            ,0x5e,"No version attribute for %s\n",fn);
  }
  else {
    iVar1 = strcmp(__s1,"1.0");
    if (iVar1 == 0) {
      pcVar4 = s3get_gvn_fattr("chksum0");
      uVar13 = (undefined7)((ulong)__s1 >> 8);
      if (pcVar4 == (char *)0x0) {
        uVar12 = (undefined4)CONCAT71(uVar13,1);
      }
      else if ((*pcVar4 == 'n') && (pcVar4[1] == 'o')) {
        uVar12 = (undefined4)CONCAT71(uVar13,pcVar4[2] == '\0');
      }
      else {
        uVar12 = 0;
      }
      iVar2 = bio_fread(&n_mgau,4,1,fp,swap,&chksum);
      if (((iVar2 == 1) && (iVar2 = bio_fread(&n_feat,4,1,fp,swap,&chksum), iVar2 == 1)) &&
         (iVar2 = bio_fread(&n_density,4,1,fp,swap,&chksum), iVar2 == 1)) {
        buf = (uint32 *)
              __ckd_calloc__((ulong)n_feat,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                             ,0x74);
        uVar3 = bio_fread(buf,4,n_feat,fp,swap,&chksum);
        if (uVar3 == n_feat) {
          iVar2 = bio_fread_1d(&raw,4,&n,fp,swap,&chksum);
          if (iVar2 < 0) {
            ckd_free(buf);
          }
          else {
            uVar7 = 0;
            iVar1 = 0;
            for (uVar6 = 0; n_feat != uVar6; uVar6 = uVar6 + 1) {
              uVar9 = buf[uVar6];
              iVar1 = iVar1 + uVar9 * uVar9;
              if (uVar7 < uVar9) {
                uVar7 = uVar9;
              }
            }
            uVar9 = iVar1 * n_mgau * n_density;
            if (n == uVar9) {
              local_70 = uVar12;
              pppppfVar5 = (vector_t ****)
                           __ckd_calloc_4d__((ulong)n_mgau,(ulong)n_feat,(ulong)n_density,
                                             (ulong)uVar7,8,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                                             ,0x8b);
              local_78 = (ulong)n_mgau;
              uVar7 = 0;
              for (uVar6 = 0; uVar6 != local_78; uVar6 = uVar6 + 1) {
                for (uVar8 = 0; uVar8 != n_feat; uVar8 = uVar8 + 1) {
                  for (uVar10 = 0; uVar10 != n_density; uVar10 = uVar10 + 1) {
                    uVar9 = buf[uVar8];
                    for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
                      pppppfVar5[uVar6][uVar8][uVar10][uVar11] = (vector_t)(raw + uVar7);
                      uVar7 = uVar7 + uVar9;
                    }
                  }
                }
              }
              if ((char)local_70 == '\0') {
                iVar2 = bio_fread(&sv_chksum,4,1,fp,swap,&ignore);
                if (iVar2 != 1) goto LAB_00103918;
                if (sv_chksum != chksum) {
                  err_msg(ERR_FATAL,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                          ,0xa2,"Checksum error; read corrupt data.\n");
                  goto LAB_00103976;
                }
                local_78 = (ulong)n_mgau;
              }
              *local_48 = pppppfVar5;
              *local_40 = (uint32)local_78;
              *local_60 = n_feat;
              *local_58 = n_density;
              *local_50 = buf;
              s3close(fp);
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                      ,0xb0,"Read %s [%ux%ux%u array of full matrices]\n",fn,(ulong)n_mgau,
                      CONCAT44(uVar14,n_feat),n_density);
              return 0;
            }
            if (need_full != 0) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                      ,0x86,"Failed to read full covariance file %s (expected %d values, got %d)\n",
                      fn,(ulong)uVar9,CONCAT44(uVar14,n));
            }
          }
        }
      }
LAB_00103918:
      s3close(fp);
      return -1;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
            ,0x5a,"Version mismatch for %s, file ver: %s != reader ver: %s\n",fn,__s1,"1.0");
  }
LAB_00103976:
  exit(1);
}

Assistant:

int
s3gau_read_maybe_full(const char *fn,
		      vector_t *****out,
		      uint32 *out_n_mgau,
		      uint32 *out_n_feat,
	  	      uint32 *out_n_density,
		      uint32 **out_veclen,
		      uint32 need_full)
{
    FILE *fp;
    const char *do_chk;
    const char *ver;
    uint32 n_mgau, n_feat, n_density;
    uint32 *veclen, maxveclen;
    uint32 blk, i, j, k, l, r, n;
    uint32 chksum = 0;
    uint32 sv_chksum, ignore = 0;
    float32 *raw;
    vector_t ****o;
    uint32 swap;

    fp = s3open(fn, "rb", &swap);
    if (fp == NULL)
	return S3_ERROR;

    /* check version id */
    ver = s3get_gvn_fattr("version");
    if (ver) {
	if (strcmp(ver, GAU_FILE_VERSION) != 0) {
	    E_FATAL("Version mismatch for %s, file ver: %s != reader ver: %s\n",
		    fn, ver, GAU_FILE_VERSION);
	}
    }
    else {
	E_FATAL("No version attribute for %s\n", fn);
    }
    
    /* if do_chk is non-NULL, there is a checksum after the data in the file */
    do_chk = s3get_gvn_fattr("chksum0");

    if (do_chk && !strcmp(do_chk, "no")) {
        do_chk = NULL;
    }
    
    if (bio_fread(&n_mgau, sizeof(uint32), 1, fp, swap, &chksum) != 1) {
	goto error;
    }

    if (bio_fread(&n_feat, sizeof(uint32), 1, fp, swap, &chksum) != 1) {
	goto error;
    }

    if (bio_fread(&n_density, sizeof(uint32), 1, fp, swap, &chksum) != 1) {
	goto error;
    }

    veclen = ckd_calloc(n_feat, sizeof(uint32));
    if (bio_fread(veclen, sizeof(uint32), n_feat, fp, swap, &chksum) != n_feat) {
	goto error;
    }

    if (bio_fread_1d((void **)&raw, sizeof(float32), &n, fp, swap, &chksum) < 0) {
	ckd_free(veclen);

	goto error;
    }

    for (i = 0, blk = 0, maxveclen = 0; i < n_feat; i++) {
	blk += veclen[i] * veclen[i];
	if (veclen[i] > maxveclen) maxveclen = veclen[i];
    }
    if (n != n_mgau * n_density * blk) {
	if (need_full)
	     E_ERROR("Failed to read full covariance file %s (expected %d values, got %d)\n",
	     	     fn, n_mgau * n_density * blk, n);
	goto error;
    }

    o = (vector_t ****)ckd_calloc_4d(n_mgau, n_feat, n_density,
				     maxveclen, sizeof(vector_t));

    for (i = 0, r = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		for (l = 0; l < veclen[j]; l++) {
		    o[i][j][k][l] = &raw[r];

		    r += veclen[j];
		}
	    }
	}
    }

    if (do_chk) {
	/* See if the checksum in the file matches that which
	   was computed from the read data */

	if (bio_fread(&sv_chksum, sizeof(uint32), 1, fp, swap, &ignore) != 1) {
            goto error;
	}

	if (sv_chksum != chksum) {
	    E_FATAL("Checksum error; read corrupt data.\n");
	}
    }


    *out = o;
    *out_n_mgau = n_mgau;
    *out_n_feat = n_feat;
    *out_n_density = n_density;
    *out_veclen = veclen;

    s3close(fp);

    E_INFO("Read %s [%ux%ux%u array of full matrices]\n",
	   fn, n_mgau, n_feat, n_density);

    return S3_SUCCESS;

error:
    if (fp) s3close(fp);

    return S3_ERROR;
}